

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

int mfdestroy(mFILE *mf)

{
  mFILE *mf_local;
  
  if (mf == (mFILE *)0x0) {
    mf_local._4_4_ = -1;
  }
  else {
    if (mf->data != (char *)0x0) {
      free(mf->data);
    }
    free(mf);
    mf_local._4_4_ = 0;
  }
  return mf_local._4_4_;
}

Assistant:

int mfdestroy(mFILE *mf) {
    if (!mf)
	return -1;

    if (mf->data)
	free(mf->data);
    free(mf);

    return 0;
}